

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *wrk,
             number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *vec)

{
  uint *puVar1;
  int iVar2;
  type_conflict5 tVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<100U,_int,_void> local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  ulong local_90;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_90 = (ulong)(uint)this->thedim;
  local_98 = wrk;
  while (0 < (int)local_90) {
    local_90 = local_90 - 1;
    iVar4 = (this->row).orig[local_90];
    iVar2 = (this->col).orig[local_90];
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 0x10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems[6] = 0;
    local_e8.data._M_elems[7] = 0;
    local_e8.data._M_elems[8] = 0;
    local_e8.data._M_elems[9] = 0;
    local_e8.data._M_elems[10] = 0;
    local_e8.data._M_elems[0xb] = 0;
    local_e8.data._M_elems[0xc] = 0;
    local_e8.data._M_elems[0xd] = 0;
    local_e8.data._M_elems._56_5_ = 0;
    local_e8.data._M_elems[0xf]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_e8,
               &(this->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar4].m_backend,&vec[iVar4].m_backend);
    puVar1 = local_98[iVar2].m_backend.data._M_elems + 0xc;
    *(undefined8 *)puVar1 = local_e8.data._M_elems._48_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(local_e8.data._M_elems[0xf]._1_3_,local_e8.data._M_elems._56_5_);
    puVar1 = local_98[iVar2].m_backend.data._M_elems + 8;
    *(undefined8 *)puVar1 = local_e8.data._M_elems._32_8_;
    *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._40_8_;
    puVar1 = local_98[iVar2].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = local_e8.data._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = local_e8.data._M_elems._24_8_;
    *(undefined8 *)local_98[iVar2].m_backend.data._M_elems = local_e8.data._M_elems._0_8_;
    *(undefined8 *)(local_98[iVar2].m_backend.data._M_elems + 2) = local_e8.data._M_elems._8_8_;
    local_98[iVar2].m_backend.exp = local_e8.exp;
    local_98[iVar2].m_backend.neg = local_e8.neg;
    local_98[iVar2].m_backend.fpclass = local_e8.fpclass;
    local_98[iVar2].m_backend.prec_elem = local_e8.prec_elem;
    local_88.data._M_elems[0xf]._1_3_ = local_e8.data._M_elems[0xf]._1_3_;
    local_88.data._M_elems._56_5_ = local_e8.data._M_elems._56_5_;
    local_88.data._M_elems[0xc] = local_e8.data._M_elems[0xc];
    local_88.data._M_elems[0xd] = local_e8.data._M_elems[0xd];
    local_88.data._M_elems[8] = local_e8.data._M_elems[8];
    local_88.data._M_elems[9] = local_e8.data._M_elems[9];
    local_88.data._M_elems[10] = local_e8.data._M_elems[10];
    local_88.data._M_elems[0xb] = local_e8.data._M_elems[0xb];
    local_88.data._M_elems[4] = local_e8.data._M_elems[4];
    local_88.data._M_elems[5] = local_e8.data._M_elems[5];
    local_88.data._M_elems[6] = local_e8.data._M_elems[6];
    local_88.data._M_elems[7] = local_e8.data._M_elems[7];
    local_88.data._M_elems[0] = local_e8.data._M_elems[0];
    local_88.data._M_elems[1] = local_e8.data._M_elems[1];
    local_88.data._M_elems[2] = local_e8.data._M_elems[2];
    local_88.data._M_elems[3] = local_e8.data._M_elems[3];
    local_88.exp = local_e8.exp;
    local_88.neg = local_e8.neg;
    local_88.fpclass = local_e8.fpclass;
    local_88.prec_elem = local_e8.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&vec[iVar4].m_backend,0.0);
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_88,(double *)&local_e8);
    if (tVar3) {
      iVar4 = (this->u).col.start[iVar2];
      lVar5 = (long)iVar4;
      lVar6 = lVar5 * 0x50;
      for (; lVar5 < (long)iVar4 + (long)(this->u).col.len[iVar2]; lVar5 = lVar5 + 1) {
        local_e8.fpclass = cpp_dec_float_finite;
        local_e8.prec_elem = 0x10;
        local_e8.data._M_elems[0] = 0;
        local_e8.data._M_elems[1] = 0;
        local_e8.data._M_elems[2] = 0;
        local_e8.data._M_elems[3] = 0;
        local_e8.data._M_elems[4] = 0;
        local_e8.data._M_elems[5] = 0;
        local_e8.data._M_elems[6] = 0;
        local_e8.data._M_elems[7] = 0;
        local_e8.data._M_elems[8] = 0;
        local_e8.data._M_elems[9] = 0;
        local_e8.data._M_elems[10] = 0;
        local_e8.data._M_elems[0xb] = 0;
        local_e8.data._M_elems[0xc] = 0;
        local_e8.data._M_elems[0xd] = 0;
        local_e8.data._M_elems._56_5_ = 0;
        local_e8.data._M_elems[0xf]._1_3_ = 0;
        local_e8.exp = 0;
        local_e8.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_e8,&local_88,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(((this->u).col.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar6));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&vec[(this->u).col.idx[lVar5]].m_backend,&local_e8);
        iVar4 = (this->u).col.start[iVar2];
        lVar6 = lVar6 + 0x50;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUright(R* wrk, R* vec) const
{

   for(int i = thedim - 1; i >= 0; i--)
   {
      int  r = row.orig[i];
      int  c = col.orig[i];
      R x = wrk[c] = diag[r] * vec[r];

      vec[r] = 0.0;

      if(x != 0.0)
         //if (isNotZero(x))
      {
         for(int j = u.col.start[c]; j < u.col.start[c] + u.col.len[c]; j++)
            vec[u.col.idx[j]] -= x * u.col.val[j];
      }
   }
}